

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

group * __thiscall
clipp::in_sequence<clipp::parameter,clipp::parameter>
          (group *__return_storage_ptr__,clipp *this,parameter *param,parameter *params)

{
  group *pgVar1;
  parameter local_268;
  parameter local_168;
  group local_68;
  parameter *local_20;
  parameter *params_local;
  parameter *param_local;
  
  local_20 = param;
  params_local = (parameter *)this;
  param_local = (parameter *)__return_storage_ptr__;
  detail::set_blocking<clipp::parameter,clipp::parameter>(true,(parameter *)this,param);
  parameter::parameter(&local_168,(parameter *)this);
  parameter::parameter(&local_268,param);
  group::group<clipp::parameter>(&local_68,&local_168,&local_268);
  pgVar1 = group::scoped(&local_68,true);
  group::group(__return_storage_ptr__,pgVar1);
  group::~group(&local_68);
  parameter::~parameter(&local_268);
  parameter::~parameter(&local_168);
  return __return_storage_ptr__;
}

Assistant:

inline group
in_sequence(Param param, Params... params)
{
    detail::set_blocking(true, param, params...);
    return group{std::move(param), std::move(params)...}.scoped(true);
}